

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O0

bool __thiscall bloaty::dwarf::LineInfoReader::ReadLineInfo(LineInfoReader *this)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  uchar uVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  uint64_t uVar8;
  value_type *pvVar9;
  LineInfoReader *pLVar10;
  LineInfoReader *in_RDI;
  FileName file_name;
  uint64_t addr;
  uint8_t extended_op;
  uint16_t len;
  uint8_t op;
  string_view data;
  undefined7 in_stack_ffffffffffffff38;
  uint8_t in_stack_ffffffffffffff3f;
  LineInfoReader *in_stack_ffffffffffffff40;
  value_type *in_stack_ffffffffffffff48;
  string_view *in_stack_ffffffffffffff50;
  LineInfo local_50;
  uint64_t local_30;
  byte local_25;
  unsigned_short local_24;
  byte local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20 [2];
  
  (in_RDI->info_).discriminator = 0;
  (in_RDI->info_).basic_block = false;
  (in_RDI->info_).prologue_end = false;
  (in_RDI->info_).epilogue_begin = false;
  (in_RDI->info_).end_sequence = false;
  local_20[0]._M_len = (in_RDI->remaining_)._M_len;
  local_20[0]._M_str = (in_RDI->remaining_)._M_str;
LAB_001fd8bd:
  while( true ) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_20);
    if (bVar2) {
      (in_RDI->remaining_)._M_len = local_20[0]._M_len;
      (in_RDI->remaining_)._M_str = local_20[0]._M_str;
      return false;
    }
    local_21 = ReadFixed<unsigned_char,1ul>((string_view *)in_stack_ffffffffffffff40);
    if (local_21 < (in_RDI->params_).opcode_base) break;
    SpecialOpcodeAdvance(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
    cVar1 = (in_RDI->params_).line_base;
    bVar3 = AdjustedOpcode(in_RDI,local_21);
    (in_RDI->info_).line =
         (int)cVar1 + (int)((ulong)bVar3 % (ulong)(long)(int)(uint)(in_RDI->params_).line_range) +
         (in_RDI->info_).line;
    if ((in_RDI->shadow_ & 1U) == 0) {
      (in_RDI->remaining_)._M_len = local_20[0]._M_len;
      (in_RDI->remaining_)._M_str = local_20[0]._M_str;
      return true;
    }
  }
  switch(local_21) {
  case 0:
    in_stack_ffffffffffffff50 = local_20;
    local_24 = ReadLEB128<unsigned_short>(in_stack_ffffffffffffff50);
    local_25 = ReadFixed<unsigned_char,1ul>((string_view *)in_stack_ffffffffffffff40);
    switch(local_25) {
    case 1:
      local_30 = (in_RDI->info_).address;
      LineInfo::LineInfo(&local_50,(in_RDI->params_).default_is_stmt != '\0');
      (in_RDI->info_).address = local_50.address;
      (in_RDI->info_).file = local_50.file;
      (in_RDI->info_).line = local_50.line;
      (in_RDI->info_).column = local_50.column;
      (in_RDI->info_).discriminator = local_50.discriminator;
      (in_RDI->info_).end_sequence = local_50.end_sequence;
      (in_RDI->info_).basic_block = local_50.basic_block;
      (in_RDI->info_).prologue_end = local_50.prologue_end;
      (in_RDI->info_).epilogue_begin = local_50.epilogue_begin;
      (in_RDI->info_).is_stmt = local_50.is_stmt;
      (in_RDI->info_).op_index = local_50.op_index;
      (in_RDI->info_).isa = local_50.isa;
      (in_RDI->info_).address = local_30;
      (in_RDI->info_).end_sequence = true;
      if ((in_RDI->shadow_ & 1U) != 0) goto LAB_001fd8bd;
      (in_RDI->remaining_)._M_len = local_20[0]._M_len;
      (in_RDI->remaining_)._M_str = local_20[0]._M_str;
      break;
    case 2:
      uVar8 = CompilationUnitSizes::ReadAddress
                        ((CompilationUnitSizes *)in_stack_ffffffffffffff40,
                         (string_view *)
                         CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      (in_RDI->info_).address = uVar8;
      (in_RDI->info_).op_index = '\0';
      in_RDI->shadow_ = (in_RDI->info_).address == 0;
      goto LAB_001fd8bd;
    case 3:
      FileName::FileName((FileName *)0x1fdb60);
      ReadNullTerminated((string_view *)0x1fdb6d);
      uVar7 = ReadLEB128<unsigned_int>(in_stack_ffffffffffffff50);
      ReadLEB128<unsigned_long>(in_stack_ffffffffffffff50);
      ReadLEB128<unsigned_long>(in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff48 = (value_type *)(ulong)uVar7;
      pvVar9 = (value_type *)
               std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::size(&in_RDI->include_directories_);
      if (pvVar9 <= in_stack_ffffffffffffff48) {
        Throw((char *)in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      }
      std::
      vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
      ::push_back((vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                   *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      goto LAB_001fd8bd;
    case 4:
      uVar7 = ReadLEB128<unsigned_int>(in_stack_ffffffffffffff50);
      (in_RDI->info_).discriminator = uVar7;
      goto LAB_001fd8bd;
    default:
      SkipBytes((size_t)in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->name);
      if (0 < verbose_level) {
        fprintf(_stderr,"bloaty: warning: unknown DWARF line table extended opcode: %d\n",
                (ulong)local_25);
      }
      goto LAB_001fd8bd;
    }
    break;
  case 1:
    if ((in_RDI->shadow_ & 1U) != 0) goto LAB_001fd8bd;
    (in_RDI->remaining_)._M_len = local_20[0]._M_len;
    (in_RDI->remaining_)._M_str = local_20[0]._M_str;
    break;
  case 2:
    ReadLEB128<unsigned_long>(in_stack_ffffffffffffff50);
    Advance(in_stack_ffffffffffffff40,CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38))
    ;
    goto LAB_001fd8bd;
  case 3:
    iVar6 = ReadLEB128<int>(in_stack_ffffffffffffff50);
    (in_RDI->info_).line = iVar6 + (in_RDI->info_).line;
    goto LAB_001fd8bd;
  case 4:
    goto switchD_001fd9e1_caseD_4;
  case 5:
    uVar7 = ReadLEB128<unsigned_int>(in_stack_ffffffffffffff50);
    (in_RDI->info_).column = uVar7;
    goto LAB_001fd8bd;
  case 6:
    (in_RDI->info_).is_stmt = (bool)(((in_RDI->info_).is_stmt ^ 0xffU) & 1);
    goto LAB_001fd8bd;
  case 7:
    (in_RDI->info_).basic_block = true;
    goto LAB_001fd8bd;
  case 8:
    SpecialOpcodeAdvance(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
    goto LAB_001fd8bd;
  case 9:
    uVar5 = ReadFixed<unsigned_short,2ul>((string_view *)in_stack_ffffffffffffff40);
    (in_RDI->info_).address = (ulong)uVar5 + (in_RDI->info_).address;
    (in_RDI->info_).op_index = '\0';
    goto LAB_001fd8bd;
  case 10:
    (in_RDI->info_).prologue_end = true;
    goto LAB_001fd8bd;
  case 0xb:
    (in_RDI->info_).epilogue_begin = true;
    goto LAB_001fd8bd;
  case 0xc:
    uVar4 = ReadLEB128<unsigned_char>(in_stack_ffffffffffffff50);
    (in_RDI->info_).isa = uVar4;
    goto LAB_001fd8bd;
  default:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              (&in_RDI->standard_opcode_lengths_,(ulong)local_21);
    SkipBytes((size_t)in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->name);
    if (0 < verbose_level) {
      fprintf(_stderr,"bloaty: warning: unknown DWARF line table opcode: %d\n",(ulong)local_21);
    }
    goto LAB_001fd8bd;
  }
  return true;
switchD_001fd9e1_caseD_4:
  uVar7 = ReadLEB128<unsigned_int>(in_stack_ffffffffffffff50);
  (in_RDI->info_).file = uVar7;
  in_stack_ffffffffffffff40 = (LineInfoReader *)(ulong)(in_RDI->info_).file;
  pLVar10 = (LineInfoReader *)
            std::
            vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
            ::size(&in_RDI->filenames_);
  if (pLVar10 <= in_stack_ffffffffffffff40) {
    Throw((char *)in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  }
  goto LAB_001fd8bd;
}

Assistant:

bool LineInfoReader::ReadLineInfo() {
  // Final step of last DW_LNS_copy / special opcode.
  info_.discriminator = 0;
  info_.basic_block = false;
  info_.prologue_end = false;
  info_.epilogue_begin = false;

  // Final step of DW_LNE_end_sequence.
  info_.end_sequence = false;

  string_view data = remaining_;

  while (true) {
    if (data.empty()) {
      remaining_ = data;
      return false;
    }

    uint8_t op = ReadFixed<uint8_t>(&data);

    if (op >= params_.opcode_base) {
      SpecialOpcodeAdvance(op);
      info_.line +=
          params_.line_base + (AdjustedOpcode(op) % params_.line_range);
      if (!shadow_) {
        remaining_ = data;
        return true;
      }
    } else {
      switch (op) {
        case DW_LNS_extended_op: {
          uint16_t len = ReadLEB128<uint16_t>(&data);
          uint8_t extended_op = ReadFixed<uint8_t>(&data);
          switch (extended_op) {
            case DW_LNE_end_sequence: {
              // Preserve address and set end_sequence, but reset everything
              // else.
              uint64_t addr = info_.address;
              info_ = LineInfo(params_.default_is_stmt);
              info_.address = addr;
              info_.end_sequence = true;
              if (!shadow_) {
                remaining_ = data;
                return true;
              }
              break;
            }
            case DW_LNE_set_address:
              info_.address = sizes_.ReadAddress(&data);
              info_.op_index = 0;
              shadow_ = (info_.address == 0);
              break;
            case DW_LNE_define_file: {
              FileName file_name;
              file_name.name = ReadNullTerminated(&data);
              file_name.directory_index = ReadLEB128<uint32_t>(&data);
              file_name.modified_time = ReadLEB128<uint64_t>(&data);
              file_name.file_size = ReadLEB128<uint64_t>(&data);
              if (file_name.directory_index >= include_directories_.size()) {
                THROW("directory index out of range");
              }
              filenames_.push_back(file_name);
              break;
            }
            case DW_LNE_set_discriminator:
              info_.discriminator = ReadLEB128<uint32_t>(&data);
              break;
            default:
              // We don't understand this opcode, skip it.
              SkipBytes(len, &data);
              if (verbose_level > 0) {
                fprintf(stderr,
                        "bloaty: warning: unknown DWARF line table extended "
                        "opcode: %d\n",
                        extended_op);
              }
              break;
          }
          break;
        }
        case DW_LNS_copy:
          if (!shadow_) {
            remaining_ = data;
            return true;
          }
          break;
        case DW_LNS_advance_pc:
          Advance(ReadLEB128<uint64_t>(&data));
          break;
        case DW_LNS_advance_line:
          info_.line += ReadLEB128<int32_t>(&data);
          break;
        case DW_LNS_set_file:
          info_.file = ReadLEB128<uint32_t>(&data);
          if (info_.file >= filenames_.size()) {
            THROW("filename index too big");
          }
          break;
        case DW_LNS_set_column:
          info_.column = ReadLEB128<uint32_t>(&data);
          break;
        case DW_LNS_negate_stmt:
          info_.is_stmt = !info_.is_stmt;
          break;
        case DW_LNS_set_basic_block:
          info_.basic_block = true;
          break;
        case DW_LNS_const_add_pc:
          SpecialOpcodeAdvance(255);
          break;
        case DW_LNS_fixed_advance_pc:
          info_.address += ReadFixed<uint16_t>(&data);
          info_.op_index = 0;
          break;
        case DW_LNS_set_prologue_end:
          info_.prologue_end = true;
          break;
        case DW_LNS_set_epilogue_begin:
          info_.epilogue_begin = true;
          break;
        case DW_LNS_set_isa:
          info_.isa = ReadLEB128<uint8_t>(&data);
          break;
        default:
          // Unknown opcode, but we know its length so can skip it.
          SkipBytes(standard_opcode_lengths_[op], &data);
          if (verbose_level > 0) {
            fprintf(stderr,
                    "bloaty: warning: unknown DWARF line table opcode: %d\n",
                    op);
          }
          break;
      }
    }
  }
}